

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ravi_alloc.c
# Opt level: O1

void ** mspace_independent_calloc(mspace msp,size_t n_elements,size_t elem_size,void **chunks)

{
  void **ppvVar1;
  size_t sz;
  size_t local_8;
  
  local_8 = elem_size;
  ppvVar1 = ialloc((mstate)msp,n_elements,&local_8,3,chunks);
  return ppvVar1;
}

Assistant:

void** mspace_independent_calloc(mspace msp, size_t n_elements,
                                 size_t elem_size, void* chunks[]) {
  size_t sz = elem_size; /* serves as 1-element array */
  mstate ms = (mstate)msp;
  if (!ok_magic(ms)) {
    USAGE_ERROR_ACTION(ms,ms);
    return 0;
  }
  return ialloc(ms, n_elements, &sz, 3, chunks);
}